

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall Fl_Preferences::set(Fl_Preferences *this,char *key,void *data,int dsize)

{
  byte bVar1;
  char *value;
  long lVar2;
  
  value = (char *)malloc((long)(dsize * 2 + 1));
  lVar2 = 0;
  for (; 0 < dsize; dsize = dsize + -1) {
    bVar1 = *(byte *)((long)data + lVar2);
    value[lVar2 * 2] = "0123456789abcdef"[bVar1 >> 4];
    value[lVar2 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    lVar2 = lVar2 + 1;
  }
  value[lVar2 * 2] = '\0';
  Node::set(this->node,key,value);
  free(value);
  return '\x01';
}

Assistant:

char Fl_Preferences::set( const char *key, const void *data, int dsize ) {
  char *buffer = (char*)malloc( dsize*2+1 ), *d = buffer;;
  unsigned char *s = (unsigned char*)data;
  for ( ; dsize>0; dsize-- ) {
    static char lu[] = "0123456789abcdef";
    unsigned char v = *s++;
    *d++ = lu[v>>4];
    *d++ = lu[v&0xf];
  }
  *d = 0;
  node->set( key, buffer );
  free( buffer );
  return 1;
}